

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_Parameters_2eproto::TableStruct::InitDefaultsImpl(void)

{
  google::protobuf::internal::VerifyVersion
            (0x2dd278,0x2dd278,
             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/Parameters.pb.cc"
            );
  google::protobuf::internal::InitProtobufDefaults();
  protobuf_DataStructures_2eproto::InitDefaults();
  Int64Parameter::Int64Parameter((Int64Parameter *)&_Int64Parameter_default_instance_);
  DAT_003520f8 = 1;
  DoubleParameter::DoubleParameter((DoubleParameter *)&_DoubleParameter_default_instance_);
  DAT_00352138 = 1;
  StringParameter::StringParameter((StringParameter *)&_StringParameter_default_instance_);
  DAT_00352168 = 1;
  BoolParameter::BoolParameter((BoolParameter *)&_BoolParameter_default_instance_);
  DAT_00352188 = 1;
  return;
}

Assistant:

void TableStruct::InitDefaultsImpl() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  ::google::protobuf::internal::InitProtobufDefaults();
  ::CoreML::Specification::protobuf_DataStructures_2eproto::InitDefaults();
  _Int64Parameter_default_instance_.DefaultConstruct();
  _DoubleParameter_default_instance_.DefaultConstruct();
  _StringParameter_default_instance_.DefaultConstruct();
  _BoolParameter_default_instance_.DefaultConstruct();
}